

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O3

string * __thiscall
absl::flags_internal::AbslUnparseFlag_abi_cxx11_
          (string *__return_storage_ptr__,flags_internal *this,string_view v)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,v._M_len,this + v._M_len,v._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::string AbslUnparseFlag(absl::string_view v) { return std::string(v); }